

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QStringView>(QCborValueRef self,QStringView key)

{
  long lVar1;
  QStringView key_00;
  bool bVar2;
  reference pEVar3;
  QCborContainerPrivate *in_RDX;
  long in_FS_OFFSET;
  QCborValueConstRef QVar4;
  Element *e;
  QCborValueRef result;
  undefined4 in_stack_ffffffffffffff88;
  ValueFlag in_stack_ffffffffffffff8c;
  QCborContainerPrivate *in_stack_ffffffffffffff90;
  QCborContainerPrivate **in_stack_ffffffffffffffc0;
  Int local_30;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar3 = QList<QtCbor::Element>::operator[]
                     ((QList<QtCbor::Element> *)in_stack_ffffffffffffff90,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (pEVar3->type == Array) {
    convertArrayToMap(in_stack_ffffffffffffffc0);
  }
  else if (pEVar3->type != Map) {
    local_2c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorage<QtCbor::Element::ValueFlag>)
         QFlags<QtCbor::Element::ValueFlag>::operator&
                   ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff8c);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2c);
    if (bVar2) {
      deref(in_stack_ffffffffffffff90);
    }
    (pEVar3->field_0).value = 0;
  }
  QFlags<QtCbor::Element::ValueFlag>::QFlags
            ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c);
  (pEVar3->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = local_30;
  pEVar3->type = Map;
  key_00.m_data = (storage_type_conflict *)self.super_QCborValueConstRef.d;
  key_00.m_size = (qsizetype)e;
  QVar4 = (QCborValueConstRef)findOrAddMapKey<QStringView>(in_RDX,key_00);
  assignContainer((QCborContainerPrivate **)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                  (QCborContainerPrivate *)0x47b708);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QCborValueRef)QVar4;
}

Assistant:

QCborValueRef
QCborContainerPrivate::findOrAddMapKey(QCborValueRef self, KeyType key)
{
    auto &e = self.d->elements[self.i];

    // we need a map, so convert if necessary
    if (e.type == QCborValue::Array) {
        convertArrayToMap(e.container);
    } else if (e.type != QCborValue::Map) {
        if (e.flags & QtCbor::Element::IsContainer)
            e.container->deref();
        e.container = nullptr;
    }
    e.flags = QtCbor::Element::IsContainer;
    e.type = QCborValue::Map;

    QCborValueRef result = findOrAddMapKey<KeyType>(e.container, key);
    assignContainer(e.container, result.d);
    return result;
}